

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VM.cpp
# Opt level: O2

void __thiscall luna::VM::GenerateClosure(VM *this,Value *a,Instruction i)

{
  _List_node_base *p_Var1;
  int iVar2;
  State *pSVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  pointer pUVar6;
  Function *pFVar7;
  Closure *pCVar8;
  Upvalue *upvalue;
  long lVar9;
  long lVar10;
  char *__assertion;
  bool bVar11;
  
  pSVar3 = this->state_;
  if ((pSVar3->calls_).super__List_base<luna::CallInfo,_std::allocator<luna::CallInfo>_>._M_impl.
      _M_node.super__List_node_base._M_next == (_List_node_base *)&pSVar3->calls_) {
    __assertion = "!state_->calls_.empty()";
  }
  else {
    p_Var4 = (pSVar3->calls_).super__List_base<luna::CallInfo,_std::allocator<luna::CallInfo>_>.
             _M_impl._M_node.super__List_node_base._M_prev;
    if ((p_Var4[1]._M_prev != (_List_node_base *)0x0) &&
       (pCVar8 = (Closure *)(p_Var4[1]._M_prev)->_M_next, pCVar8 != (Closure *)0x0)) {
      pFVar7 = Closure::GetPrototype(pCVar8);
      pFVar7 = Function::GetChildFunction(pFVar7,i.opcode_ & 0xffff);
      a->type_ = ValueT_Closure;
      pCVar8 = State::NewClosure(this->state_);
      (a->field_0).closure_ = pCVar8;
      Closure::SetPrototype(pCVar8,pFVar7);
      pCVar8 = (a->field_0).closure_;
      p_Var5 = (p_Var4[1]._M_prev)->_M_next;
      lVar10 = (long)(pFVar7->upvalues_).
                     super__Vector_base<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pFVar7->upvalues_).
                     super__Vector_base<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4;
      lVar9 = 0xc;
      while (bVar11 = lVar10 != 0, lVar10 = lVar10 + -1, bVar11) {
        pUVar6 = (pFVar7->upvalues_).
                 super__Vector_base<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (*(char *)((long)pUVar6 + lVar9 + -4) == '\x01') {
          iVar2 = *(int *)((long)&pUVar6->name_ + lVar9);
          p_Var1 = p_Var4[1]._M_next + iVar2;
          if (*(int *)&p_Var4[1]._M_next[iVar2]._M_prev == 6) {
            upvalue = (Upvalue *)p_Var1->_M_next;
          }
          else {
            upvalue = State::NewUpvalue(this->state_);
            (upvalue->value_).field_0.upvalue_ = (Upvalue *)p_Var1->_M_next;
            (upvalue->value_).type_ = *(ValueT *)&p_Var1->_M_prev;
            *(undefined4 *)&p_Var1->_M_prev = 6;
            p_Var1->_M_next = (_List_node_base *)upvalue;
          }
        }
        else {
          upvalue = (Upvalue *)
                    (&(p_Var5[2]._M_next)->_M_next)[*(int *)((long)&pUVar6->name_ + lVar9)];
        }
        Closure::AddUpvalue(pCVar8,upvalue);
        lVar9 = lVar9 + 0x10;
      }
      return;
    }
    __assertion = "call->func_ && call->func_->closure_";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/VM.cpp",
                0x152,"void luna::VM::GenerateClosure(Value *, Instruction)");
}

Assistant:

void VM::GenerateClosure(Value *a, Instruction i)
    {
        GET_CALLINFO_AND_PROTO();
        auto a_proto = proto->GetChildFunction(Instruction::GetParamBx(i));
        a->type_ = ValueT_Closure;
        a->closure_ = state_->NewClosure();
        a->closure_->SetPrototype(a_proto);

        // Prepare all upvalues
        auto new_closure = a->closure_;
        auto closure = call->func_->closure_;
        auto count = a_proto->GetUpvalueCount();
        for (std::size_t i = 0; i < count; ++i)
        {
            auto upvalue_info = a_proto->GetUpvalue(i);
            if (upvalue_info->parent_local_)
            {
                // Transform local variable to upvalue
                auto reg = call->register_ + upvalue_info->register_index_;
                if (reg->type_ != ValueT_Upvalue)
                {
                    auto upvalue = state_->NewUpvalue();
                    upvalue->SetValue(*reg);
                    reg->type_ = ValueT_Upvalue;
                    reg->upvalue_ = upvalue;
                    new_closure->AddUpvalue(upvalue);
                }
                else
                {
                    new_closure->AddUpvalue(reg->upvalue_);
                }
            }
            else
            {
                // Get upvalue from parent upvalue list
                auto upvalue = closure->GetUpvalue(upvalue_info->register_index_);
                new_closure->AddUpvalue(upvalue);
            }
        }
    }